

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# board.cc
# Opt level: O0

void __thiscall board::Board::print(Board *this)

{
  int iVar1;
  ostream *poVar2;
  int local_20;
  int local_1c;
  int file;
  int rank;
  int piece;
  int square;
  Board *this_local;
  
  if (this->side == 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"     white");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"     black");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  for (local_1c = 7; -1 < local_1c; local_1c = local_1c + -1) {
    for (local_20 = 0; local_20 < 8; local_20 = local_20 + 1) {
      iVar1 = FR2SQ(local_20,local_1c);
      poVar2 = std::operator<<((ostream *)&std::cout,PIECE_CHARS[this->board[iVar1]]);
      std::operator<<(poVar2," ");
    }
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void board::Board::print() const
{
    int square;
    int piece;
    if (side == WHITE) {
        std::cout << "     white" << std::endl;
    }
    else {
        std::cout << "     black" << std::endl;
    }
    for (int rank = RANK_8; rank >= RANK_1; rank--) {
        for (int file = FILE_A; file <= FILE_H; file++) {
            square = FR2SQ(file, rank);
            piece = board[square];
            std::cout << PIECE_CHARS[piece] << " ";
        }
        std::cout << std::endl;
    }
}